

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::Pointer::IsSameImpl(Pointer *this,Type *that,IsSameCache *seen)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_bool>
  pVar3;
  bool same_pointee;
  Pointer *local_60;
  Pointer *local_58;
  pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*> local_50;
  const_iterator local_40;
  pair<std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_bool>
  p;
  Pointer *pt;
  IsSameCache *seen_local;
  Type *that_local;
  Pointer *this_local;
  
  iVar1 = (*that->_vptr_Type[0x20])();
  p._8_8_ = CONCAT44(extraout_var,iVar1);
  if (p._8_8_ == 0) {
    this_local._7_1_ = false;
  }
  else if (this->storage_class_ == *(StorageClass *)(p._8_8_ + 0x30)) {
    local_58 = this;
    iVar1 = (*that->_vptr_Type[0x20])();
    local_60 = (Pointer *)CONCAT44(extraout_var_00,iVar1);
    local_50 = std::
               make_pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>
                         (&local_58,&local_60);
    pVar3 = std::
            set<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
            ::insert(seen,&local_50);
    local_40._M_node = (_Base_ptr)pVar3.first._M_node;
    p.first._M_node._0_1_ = pVar3.second;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      this_local._7_1_ = true;
    }
    else {
      uVar2 = (*this->pointee_type_->_vptr_Type[2])
                        (this->pointee_type_,*(undefined8 *)(p._8_8_ + 0x28),seen);
      std::
      set<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::less<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::allocator<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>>
      ::erase_abi_cxx11_((set<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::less<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::allocator<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>>
                          *)seen,local_40);
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = Type::HasSameDecorations(&this->super_Type,that);
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Pointer::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Pointer* pt = that->AsPointer();
  if (!pt) return false;
  if (storage_class_ != pt->storage_class_) return false;
  auto p = seen->insert(std::make_pair(this, that->AsPointer()));
  if (!p.second) {
    return true;
  }
  bool same_pointee = pointee_type_->IsSameImpl(pt->pointee_type_, seen);
  seen->erase(p.first);
  if (!same_pointee) {
    return false;
  }
  return HasSameDecorations(that);
}